

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIFT.cpp
# Opt level: O3

void findMatches(vector<extrema,_std::allocator<extrema>_> *ex1,
                vector<extrema,_std::allocator<extrema>_> *ex2,
                vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *matchKP1,
                vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_> *matchKP2,uint *cnt_match
                )

{
  double dVar1;
  long lVar2;
  pointer pdVar3;
  pointer peVar4;
  ostream *poVar5;
  pointer pvVar6;
  int iVar7;
  ulong uVar8;
  pointer peVar9;
  long lVar10;
  pointer piVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  pointer pvVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  double dVar21;
  pair<double,_int> pVar22;
  vector<double,_std::allocator<double>_> everyMinDist;
  vector<int,_std::allocator<int>_> SecondMinIdx;
  vector<int,_std::allocator<int>_> MinIdx;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  everyDist;
  vector<double,_std::allocator<double>_> everySecondMinDist;
  value_type local_f8;
  vector<int,_std::allocator<int>_> local_d8;
  vector<extrema,_std::allocator<extrema>_> *local_c0;
  Point_<int> local_b8;
  int local_b0 [2];
  vector<int,_std::allocator<int>_> local_a8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_88;
  vector<double,_std::allocator<double>_> local_68;
  uint *local_48;
  vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *local_40;
  vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *local_38;
  
  local_88.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_88.
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = ex1;
  local_48 = cnt_match;
  local_40 = (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)matchKP2;
  local_38 = (vector<cv::Point_<int>,std::allocator<cv::Point_<int>>> *)matchKP1;
  if ((ex1->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.super__Vector_impl_data.
      _M_start !=
      (ex1->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    uVar12 = 0;
    do {
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (double *)0x0;
      local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (double *)0x0;
      peVar9 = (ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
               super__Vector_impl_data._M_start;
      peVar4 = (ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (peVar4 != peVar9) {
        uVar16 = 0;
        do {
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          pvVar17 = peVar9[uVar16].NeighborCells.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar10 = (long)peVar9[uVar16].NeighborCells.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar17;
          if (lVar10 == 0) {
            pdVar3 = (pointer)0x0;
          }
          else {
            lVar10 = (lVar10 >> 3) * -0x5555555555555555;
            pdVar3 = (pointer)0x0;
            lVar13 = 0;
            do {
              lVar2 = *(long *)&pvVar17[lVar13].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl;
              lVar14 = (long)*(pointer *)
                              ((long)&pvVar17[lVar13].
                                      super__Vector_base<double,_std::allocator<double>_>._M_impl +
                              8) - lVar2;
              if (lVar14 != 0) {
                lVar14 = lVar14 >> 3;
                lVar15 = 0;
                do {
                  dVar21 = *(double *)
                            (*(long *)(*(long *)&(local_c0->
                                                 super__Vector_base<extrema,_std::allocator<extrema>_>
                                                 )._M_impl.super__Vector_impl_data._M_start[uVar12].
                                                 NeighborCells.
                                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                                 ._M_impl.super__Vector_impl_data + lVar13 * 0x18) +
                            lVar15 * 8) - *(double *)(lVar2 + lVar15 * 8);
                  pdVar3 = (pointer)((double)pdVar3 + dVar21 * dVar21);
                  lVar15 = lVar15 + 1;
                  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start = pdVar3;
                } while (lVar14 + (ulong)(lVar14 == 0) != lVar15);
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 != lVar10 + (ulong)(lVar10 == 0));
          }
          if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                      ((vector<double,std::allocator<double>> *)&local_f8,
                       (iterator)
                       local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish,(double *)&local_68);
            peVar4 = (ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
          }
          else {
            *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish = (double)pdVar3;
            local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar16 = uVar16 + 1;
          peVar9 = (ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = ((long)peVar4 - (long)peVar9 >> 4) * 0x6db6db6db6db6db7;
        } while (uVar16 <= uVar8 && uVar8 - uVar16 != 0);
      }
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_88,&local_f8);
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar12 = uVar12 + 1;
      uVar16 = ((long)(local_c0->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(local_c0->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7;
    } while (uVar12 <= uVar16 && uVar16 - uVar12 != 0);
  }
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  if (local_88.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_88.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar12 = 0;
    pvVar17 = local_88.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      pdVar3 = pvVar17[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = 0;
      uVar20 = 0x4197d784;
      uVar19 = 0;
      lVar10 = (long)pvVar17[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar3;
      if (lVar10 != 0) {
        lVar10 = lVar10 >> 3;
        uVar8 = 0;
        uVar16 = 0;
        dVar21 = 100000000.0;
        do {
          dVar1 = pdVar3[uVar8];
          uVar18 = SUB84(dVar1,0);
          uVar20 = (undefined4)((ulong)dVar1 >> 0x20);
          if (dVar1 < dVar21) {
            uVar16 = uVar8 & 0xffffffff;
          }
          uVar19 = (undefined4)uVar16;
          if (dVar21 <= dVar1) {
            uVar18 = SUB84(dVar21,0);
            uVar20 = (undefined4)((ulong)dVar21 >> 0x20);
          }
          uVar8 = uVar8 + 1;
          dVar21 = (double)CONCAT44(uVar20,uVar18);
        } while (lVar10 + (ulong)(lVar10 == 0) != uVar8);
      }
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(uVar20,uVar18);
      if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = uVar19;
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_f8,
                   (iterator)
                   local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,(double *)&local_d8);
        pvVar17 = local_88.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        *local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = (double)CONCAT44(uVar20,uVar18);
        local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      pdVar3 = pvVar17[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = (long)pvVar17[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish - (long)pdVar3;
      if (lVar10 == 0) {
        iVar7 = 0;
        uVar19 = 0;
        uVar18 = 0x4197d784;
      }
      else {
        lVar10 = lVar10 >> 3;
        uVar8 = 0;
        uVar16 = 0;
        dVar21 = 100000000.0;
        do {
          dVar1 = pdVar3[uVar8];
          uVar19 = SUB84(dVar1,0);
          uVar18 = (undefined4)((ulong)dVar1 >> 0x20);
          if (dVar1 < dVar21) {
            uVar16 = uVar8 & 0xffffffff;
          }
          iVar7 = (int)uVar16;
          if (dVar21 <= dVar1) {
            uVar19 = SUB84(dVar21,0);
            uVar18 = (undefined4)((ulong)dVar21 >> 0x20);
          }
          uVar8 = uVar8 + 1;
          dVar21 = (double)CONCAT44(uVar18,uVar19);
        } while (lVar10 + (ulong)(lVar10 == 0) != uVar8);
      }
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)CONCAT44(uVar18,uVar19);
      local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)CONCAT44(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish._4_4_,iVar7);
      if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_a8,
                   (iterator)
                   local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,
                   (int *)&local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish);
        pvVar17 = local_88.
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      }
      else {
        *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar7;
        local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar12 = uVar12 + 1;
      uVar16 = ((long)local_88.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar17 >> 3) *
               -0x5555555555555555;
    } while (uVar12 <= uVar16 && uVar16 - uVar12 != 0);
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (int *)0x0;
    local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (int *)0x0;
    if (local_88.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pvVar17) {
      lVar13 = 0;
      lVar10 = 0;
      uVar12 = 0;
      do {
        piVar11 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pVar22 = secondMin((vector<double,_std::allocator<double>_> *)
                           ((long)&(pvVar17->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar13),
                           (int *)((long)local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start + lVar10));
        local_b8 = (Point_<int>)pVar22.first;
        local_b0[0] = pVar22.second;
        if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                    (&local_68,
                     (iterator)
                     local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish,(double *)&local_b8);
          piVar11 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pvVar17 = local_88.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish = (double)local_b8;
          local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        pVar22 = secondMin((vector<double,_std::allocator<double>_> *)
                           ((long)&(pvVar17->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data._M_start + lVar13),
                           (int *)((long)piVar11 + lVar10));
        local_b8 = (Point_<int>)pVar22.first;
        local_b0[0] = pVar22.second;
        if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_d8,
                     (iterator)
                     local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,local_b0);
          pvVar17 = local_88.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = local_b0[0];
          local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar12 = uVar12 + 1;
        uVar16 = ((long)local_88.
                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar17 >> 3) *
                 -0x5555555555555555;
        lVar10 = lVar10 + 4;
        lVar13 = lVar13 + 0x18;
      } while (uVar12 <= uVar16 && uVar16 - uVar12 != 0);
      if (local_88.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pvVar17) {
        lVar10 = 0;
        uVar12 = 0;
        pvVar6 = local_88.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        do {
          if ((local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar12] < 1.0) ||
             (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12] /
              local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12] < 0.8)) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
            poVar5 = std::ostream::_M_insert<double>
                               ((double)*(float *)((long)&(((local_c0->
                                                                                                                        
                                                  super__Vector_base<extrema,_std::allocator<extrema>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->pt).x
                                                  + lVar10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            poVar5 = std::ostream::_M_insert<double>
                               ((double)*(float *)((long)&(((local_c0->
                                                                                                                        
                                                  super__Vector_base<extrema,_std::allocator<extrema>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->pt).y
                                                  + lVar10));
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,") match (",9);
            poVar5 = std::ostream::_M_insert<double>
                               ((double)(ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)
                                        ._M_impl.super__Vector_impl_data._M_start
                                        [local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[uVar12]].pt.x);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
            poVar5 = std::ostream::_M_insert<double>
                               ((double)(ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)
                                        ._M_impl.super__Vector_impl_data._M_start
                                        [local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                         _M_impl.super__Vector_impl_data._M_start[uVar12]].pt.y);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,")",1);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
            std::ostream::put((char)poVar5);
            std::ostream::flush();
            peVar9 = (local_c0->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            local_b8.y = (int)ROUND(*(float *)((long)&(peVar9->pt).y + lVar10));
            local_b8.x = (int)ROUND(*(float *)((long)&(peVar9->pt).x + lVar10));
            std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
            emplace_back<cv::Point_<int>>(local_38,&local_b8);
            peVar9 = (ex2->super__Vector_base<extrema,_std::allocator<extrema>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            local_b8.y = (int)ROUND(peVar9[local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar12]].pt.y);
            local_b8.x = (int)ROUND(peVar9[local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                           _M_impl.super__Vector_impl_data._M_start[uVar12]].pt.x);
            std::vector<cv::Point_<int>,std::allocator<cv::Point_<int>>>::
            emplace_back<cv::Point_<int>>(local_40,&local_b8);
            *local_48 = *local_48 + 1;
            pvVar6 = local_88.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            pvVar17 = local_88.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          }
          uVar12 = uVar12 + 1;
          uVar16 = ((long)pvVar6 - (long)pvVar17 >> 3) * -0x5555555555555555;
          lVar10 = lVar10 + 0x70;
        } while (uVar12 <= uVar16 && uVar16 - uVar12 != 0);
      }
      goto LAB_00106edc;
    }
  }
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
LAB_00106edc:
  if (local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_88);
  return;
}

Assistant:

void findMatches(const vector<extrema>& ex1, const vector<extrema>& ex2, vector<Point>& matchKP1, vector<Point>& matchKP2, unsigned& cnt_match){
    double min_dist = 1000;
    for(const auto& i:ex1){
        for(const auto& j:ex2){
            double dist = 0;
            for(int k = 0; k < j.NeighborCells.size(); k++){
                for(int l = 0; l < j.NeighborCells[k].size(); l++){
                    dist += pow(i.NeighborCells[k][l] - j.NeighborCells[k][l], 2);
                }
            }
            if(dist < min_dist) min_dist = dist;
        }
    }

    vector<vector<double> > everyDist;
    for(int i = 0; i < ex1.size(); i++){
        vector<double> tmpEveryDist;
        for(int j = 0; j < ex2.size(); j++){
            double tmpSum = 0;
            for(int k = 0; k < ex2[j].NeighborCells.size(); k++){
                for(int l = 0; l < ex2[j].NeighborCells[k].size(); l++){
                    tmpSum += pow(ex1[i].NeighborCells[k][l] - ex2[j].NeighborCells[k][l], 2);
                }
            }
            tmpEveryDist.push_back(tmpSum);
        }
        everyDist.push_back(tmpEveryDist);
    }

    vector<double> everyMinDist, everySecondMinDist;
    vector<int> MinIdx;
    for(int i = 0; i < everyDist.size(); i++){
        everyMinDist.push_back(Min(everyDist[i]).first);
        MinIdx.push_back(Min(everyDist[i]).second);
    }
    vector<int> SecondMinIdx;
    for(int i = 0; i < everyDist.size(); i++){
        everySecondMinDist.push_back(secondMin(everyDist[i], MinIdx[i]).first);
        SecondMinIdx.push_back(secondMin(everyDist[i], MinIdx[i]).second);
    }
    for(int i = 0; i < everyDist.size(); i++){
        if(everyMinDist[i]/double(everySecondMinDist[i]) < match_ratio || everyMinDist[i] < 1 ){
            cout << "(" << ex1[i].pt.x << ", " << ex1[i].pt.y << ") match ("
                << ex2[MinIdx[i]].pt.x << ", " << ex2[MinIdx[i]].pt.y << ")" << endl;
            matchKP1.push_back(ex1[i].pt);
            matchKP2.push_back(ex2[MinIdx[i]].pt);
            cnt_match++;
        }
    }
}